

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

ssize_t __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::read(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  ulong uVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 extraout_var;
  undefined8 extraout_RAX_01;
  uint8_t output;
  Port port;
  byte bVar4;
  
  access(this,(char *)(ulong)(__fd & 0xfU),(int)__buf);
  switch(__fd & 0xfU) {
  case 0:
    puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
    *puVar1 = *puVar1 & 0xe7;
    reevaluate_interrupts(this);
    uVar2 = (this->super_MOS6522Storage).registers_.data_direction[1];
    output = (this->super_MOS6522Storage).registers_.output[1];
    bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x80;
    port = B;
    goto LAB_002b146d;
  default:
    puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
    *puVar1 = *puVar1 & 0xfc;
    reevaluate_interrupts(this);
    uVar2 = (this->super_MOS6522Storage).registers_.data_direction[0];
    output = (this->super_MOS6522Storage).registers_.output[0];
    port = A;
    bVar4 = 0;
LAB_002b146d:
    uVar2 = get_port_input(this,port,uVar2,output,bVar4);
    return CONCAT71(extraout_var,uVar2);
  case 2:
    uVar3 = CONCAT71(0x4553,(this->super_MOS6522Storage).registers_.data_direction[1]);
    break;
  case 3:
    uVar3 = CONCAT71(0x4553,(this->super_MOS6522Storage).registers_.data_direction[0]);
    break;
  case 4:
    puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
    *puVar1 = *puVar1 & 0xbf;
    reevaluate_interrupts(this);
    uVar3 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),
                     (char)(this->super_MOS6522Storage).registers_.timer[0]);
    break;
  case 5:
    uVar3 = CONCAT71(0x4553,*(undefined1 *)((long)(this->super_MOS6522Storage).registers_.timer + 1)
                    );
    break;
  case 6:
    uVar3 = CONCAT71(0x4553,(char)(this->super_MOS6522Storage).registers_.timer_latch[0]);
    break;
  case 7:
    uVar3 = CONCAT71(0x4553,*(undefined1 *)
                             ((long)(this->super_MOS6522Storage).registers_.timer_latch + 1));
    break;
  case 8:
    puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
    *puVar1 = *puVar1 & 0xdf;
    reevaluate_interrupts(this);
    uVar3 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),
                     (char)(this->super_MOS6522Storage).registers_.timer[1]);
    break;
  case 9:
    uVar3 = CONCAT71(0x4553,*(undefined1 *)((long)(this->super_MOS6522Storage).registers_.timer + 3)
                    );
    break;
  case 10:
    (this->super_MOS6522Storage).shift_bits_remaining_ = 8;
    puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
    *puVar1 = *puVar1 & 0xfb;
    reevaluate_interrupts(this);
    uVar3 = CONCAT71((int7)((ulong)extraout_RAX >> 8),(this->super_MOS6522Storage).registers_.shift)
    ;
    break;
  case 0xb:
    uVar3 = CONCAT71(0x4553,(this->super_MOS6522Storage).registers_.auxiliary_control);
    break;
  case 0xc:
    uVar3 = CONCAT71(0x4553,(this->super_MOS6522Storage).registers_.peripheral_control);
    break;
  case 0xd:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    uVar3 = CONCAT71(0x4553,(((this->super_MOS6522Storage).registers_.interrupt_enable & bVar4 &
                             0x7f) != 0) << 7 | bVar4);
    break;
  case 0xe:
    uVar3 = CONCAT71(0x4553,(this->super_MOS6522Storage).registers_.interrupt_enable) | 0x80;
  }
  return uVar3;
}

Assistant:

uint8_t MOS6522<T>::read(int address) {
	address &= 0xf;
	access(address);
	switch(address) {
		case 0x0:	// Read Port B ('IRB').
			registers_.interrupt_flags &= ~(InterruptFlag::CB1ActiveEdge | InterruptFlag::CB2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::B, registers_.data_direction[1], registers_.output[1], registers_.auxiliary_control & 0x80);
		case 0xf:
		case 0x1:	// Read Port A ('IRA').
			registers_.interrupt_flags &= ~(InterruptFlag::CA1ActiveEdge | InterruptFlag::CA2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::A, registers_.data_direction[0], registers_.output[0], 0);

		case 0x2:	return registers_.data_direction[1];	// Port B direction ('DDRB').
		case 0x3:	return registers_.data_direction[0];	// Port A direction ('DDRA').

		// Timer 1
		case 0x4:	// Timer 1 low-order latches ('T1L-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer1;
			reevaluate_interrupts();
		return registers_.timer[0] & 0x00ff;
		case 0x5:	return registers_.timer[0] >> 8;			// Timer 1 high-order counter ('T1C-H')
		case 0x6:	return registers_.timer_latch[0] & 0x00ff;	// Timer 1 low-order latches ('T1L-L').
		case 0x7:	return registers_.timer_latch[0] >> 8;		// Timer 1 high-order latches ('T1L-H').

		// Timer 2
		case 0x8:	// Timer 2 low-order counter ('T2C-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer2;
			reevaluate_interrupts();
		return registers_.timer[1] & 0x00ff;
		case 0x9:	return registers_.timer[1] >> 8;	// Timer 2 high-order counter ('T2C-H').

		case 0xa:	// Shift register ('SR').
			shift_bits_remaining_ = 8;
			registers_.interrupt_flags &= ~InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		return registers_.shift;

		case 0xb:	return registers_.auxiliary_control;	// Auxiliary control ('ACR').
		case 0xc:	return registers_.peripheral_control;	// Peripheral control ('PCR').

		case 0xd:	return registers_.interrupt_flags | (get_interrupt_line() ? 0x80 : 0x00);	// Interrupt flag register ('IFR').
		case 0xe:	return registers_.interrupt_enable | 0x80;									// Interrupt enable register ('IER').
	}

	return 0xff;
}